

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O0

void __thiscall SortByPTypeProcessTest::SetUp(SortByPTypeProcessTest *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  SortByPTypeProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar7;
  aiMesh *this_02;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  aiNode *paVar12;
  aiNode **ppaVar13;
  uint *puVar14;
  aiVector3t<float> *local_1d0;
  aiVector3t<float> *local_1a8;
  aiVector3t<float> *local_180;
  aiVector3t<float> *local_158;
  aiVector3t<float> *local_130;
  aiFace *local_f8;
  aiNode *node;
  float fStack_c8;
  uint i_1;
  float local_c0;
  aiVector3t<float> local_bc;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a4;
  aiVector3t<float> local_98;
  float local_8c;
  float local_88;
  float f;
  uint q;
  uint idx;
  uint m;
  uint n;
  uint remaining [4];
  aiVector3D *local_60;
  aiVector3D *puv;
  aiVector3D *pb;
  aiVector3D *pt;
  aiVector3D *pn;
  aiVector3D *pv;
  aiFace *faces;
  aiMesh *mesh;
  uint i;
  bool five;
  SortByPTypeProcessTest *this_local;
  
  this_00 = (SortByPTypeProcess *)operator_new(0x20);
  Assimp::SortByPTypeProcess::SortByPTypeProcess(this_00);
  this->mProcess1 = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->mScene = this_01;
  this->mScene->mNumMeshes = 10;
  ppaVar7 = (aiMesh **)operator_new__(0x50);
  this->mScene->mMeshes = ppaVar7;
  bVar6 = false;
  for (mesh._4_4_ = 0; mesh._4_4_ < 10; mesh._4_4_ = mesh._4_4_ + 1) {
    this_02 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_02);
    this->mScene->mMeshes[mesh._4_4_] = this_02;
    this_02->mNumFaces = 1000;
    puVar8 = (undefined8 *)operator_new__(0x3e88);
    *puVar8 = 1000;
    pv = (aiVector3D *)(puVar8 + 1);
    local_f8 = (aiFace *)pv;
    do {
      aiFace::aiFace(local_f8);
      local_f8 = local_f8 + 1;
    } while (local_f8 != (aiFace *)(puVar8 + 0x7d1));
    this_02->mFaces = (aiFace *)pv;
    uVar10 = CONCAT44(0,this_02->mNumFaces * 5);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar9 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pn = (aiVector3D *)operator_new__(uVar9);
    if (uVar10 != 0) {
      local_130 = pn;
      do {
        aiVector3t<float>::aiVector3t(local_130);
        local_130 = local_130 + 1;
      } while (local_130 != pn + uVar10);
    }
    this_02->mVertices = pn;
    uVar10 = CONCAT44(0,this_02->mNumFaces * 5);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar9 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pt = (aiVector3D *)operator_new__(uVar9);
    if (uVar10 != 0) {
      local_158 = pt;
      do {
        aiVector3t<float>::aiVector3t(local_158);
        local_158 = local_158 + 1;
      } while (local_158 != pt + uVar10);
    }
    this_02->mNormals = pt;
    uVar10 = CONCAT44(0,this_02->mNumFaces * 5);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    uVar9 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pb = (aiVector3D *)operator_new__(uVar9);
    if (uVar10 != 0) {
      local_180 = pb;
      do {
        aiVector3t<float>::aiVector3t(local_180);
        local_180 = local_180 + 1;
      } while (local_180 != pb + uVar10);
    }
    this_02->mTangents = pb;
    uVar10 = CONCAT44(0,this_02->mNumFaces * 5);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10;
    uVar9 = SUB168(auVar4 * ZEXT816(0xc),0);
    if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    puv = (aiVector3D *)operator_new__(uVar9);
    if (uVar10 != 0) {
      local_1a8 = puv;
      do {
        aiVector3t<float>::aiVector3t(local_1a8);
        local_1a8 = local_1a8 + 1;
      } while (local_1a8 != puv + uVar10);
    }
    this_02->mBitangents = puv;
    uVar10 = CONCAT44(0,this_02->mNumFaces * 5);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10;
    uVar9 = SUB168(auVar5 * ZEXT816(0xc),0);
    if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    local_60 = (aiVector3D *)operator_new__(uVar9);
    if (uVar10 != 0) {
      local_1d0 = local_60;
      do {
        aiVector3t<float>::aiVector3t(local_1d0);
        local_1d0 = local_1d0 + 1;
      } while (local_1d0 != local_60 + uVar10);
    }
    this_02->mTextureCoords[0] = local_60;
    m = ::num[mesh._4_4_][0];
    n = ::num[mesh._4_4_][1];
    remaining[0] = ::num[mesh._4_4_][2];
    remaining[1] = ::num[mesh._4_4_][3];
    idx = 0;
    for (q = 0; q < 1000; q = q + 1) {
      f = (float)(q & 3);
      while ((&m)[(uint)f] == 0) {
        f = (float)((int)f + 1);
        if (f == 5.60519e-45) {
          f = 0.0;
        }
      }
      pv->x = (float)((int)f + 1);
      if (pv->x == 5.60519e-45) {
        if (bVar6) {
          pv->x = (float)((int)pv->x + 1);
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      auVar1 = ZEXT416((uint)pv->x) * ZEXT816(4);
      uVar10 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar10 = 0xffffffffffffffff;
      }
      pvVar11 = operator_new__(uVar10);
      *(void **)&pv->z = pvVar11;
      for (local_88 = 0.0; (uint)local_88 < (uint)pv->x; local_88 = (float)((int)local_88 + 1)) {
        *(uint *)(*(long *)&pv->z + (ulong)(uint)local_88 * 4) = idx;
        local_8c = (float)(&m)[(uint)f];
        aiVector3t<float>::aiVector3t
                  (&local_98,local_8c,local_8c + 1.0,local_8c + (float)(uint)local_88);
        pn->z = local_98.z;
        pn->x = local_98.x;
        pn->y = local_98.y;
        aiVector3t<float>::aiVector3t
                  (&local_a4,local_8c,local_8c + 1.0,local_8c + (float)(uint)local_88);
        pt->z = local_a4.z;
        pt->x = local_a4.x;
        pt->y = local_a4.y;
        aiVector3t<float>::aiVector3t
                  (&local_b0,local_8c,local_8c + 1.0,local_8c + (float)(uint)local_88);
        pb->z = local_b0.z;
        pb->x = local_b0.x;
        pb->y = local_b0.y;
        aiVector3t<float>::aiVector3t
                  (&local_bc,local_8c,local_8c + 1.0,local_8c + (float)(uint)local_88);
        puv->z = local_bc.z;
        puv->x = local_bc.x;
        puv->y = local_bc.y;
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)&stack0xffffffffffffff38,local_8c,local_8c + 1.0,
                   local_8c + (float)(uint)local_88);
        local_60->x = fStack_c8;
        local_60->y = (float)i_1;
        local_60->z = local_c0;
        idx = idx + 1;
        local_60 = local_60 + 1;
        puv = puv + 1;
        pb = pb + 1;
        pt = pt + 1;
        pn = pn + 1;
      }
      pv = (aiVector3D *)&pv[1].y;
      (&m)[(uint)f] = (&m)[(uint)f] - 1;
    }
    this_02->mNumVertices = idx;
  }
  paVar12 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar12);
  this->mScene->mRootNode = paVar12;
  this->mScene->mRootNode->mNumChildren = 5;
  ppaVar13 = (aiNode **)operator_new__(0x28);
  this->mScene->mRootNode->mChildren = ppaVar13;
  for (node._4_4_ = 0; node._4_4_ < 5; node._4_4_ = node._4_4_ + 1) {
    paVar12 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar12);
    this->mScene->mRootNode->mChildren[node._4_4_] = paVar12;
    paVar12->mNumMeshes = 2;
    puVar14 = (uint *)operator_new__(8);
    paVar12->mMeshes = puVar14;
    *paVar12->mMeshes = node._4_4_ << 1;
    paVar12->mMeshes[1] = node._4_4_ * 2 + 1;
  }
  return;
}

Assistant:

void SortByPTypeProcessTest::SetUp() {
    mProcess1 = new SortByPTypeProcess();
    mScene = new aiScene();

    mScene->mNumMeshes = 10;
    mScene->mMeshes = new aiMesh*[10];

    bool five = false;
    for (unsigned int i = 0; i < 10; ++i) {
        aiMesh* mesh = mScene->mMeshes[i] = new aiMesh();
        mesh->mNumFaces = 1000;
        aiFace* faces =  mesh->mFaces = new aiFace[1000];
        aiVector3D* pv = mesh->mVertices = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pn = mesh->mNormals = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* pt = mesh->mTangents = new aiVector3D[mesh->mNumFaces*5];
        aiVector3D* pb = mesh->mBitangents = new aiVector3D[mesh->mNumFaces*5];

        aiVector3D* puv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumFaces*5];

        unsigned int remaining[4] = {num[i][0],num[i][1],num[i][2],num[i][3]};
        unsigned int n = 0;
        for (unsigned int m = 0; m < 1000; ++m) {
            unsigned int idx = m % 4;
            while (true) {
                if (!remaining[idx]) {
                    if (4 == ++idx) {
                        idx = 0;
                    }
                    continue;
                }
                break;
            }
            faces->mNumIndices = idx+1;
            if (4 == faces->mNumIndices) {
                if(five)++faces->mNumIndices;
                five = !five;
            }
            faces->mIndices = new unsigned int[faces->mNumIndices];
            for (unsigned int q = 0; q <faces->mNumIndices;++q,++n) {
                faces->mIndices[q] = n;
                float f = (float)remaining[idx];

                // (the values need to be unique - otherwise all degenerates would be removed)
                *pv++ = aiVector3D(f,f+1.f,f+q);
                *pn++ = aiVector3D(f,f+1.f,f+q);
                *pt++ = aiVector3D(f,f+1.f,f+q);
                *pb++ = aiVector3D(f,f+1.f,f+q);
                *puv++ = aiVector3D(f,f+1.f,f+q);
            }
            ++faces;
            --remaining[idx];
        }
        mesh->mNumVertices = n;
    }

    mScene->mRootNode = new aiNode();
    mScene->mRootNode->mNumChildren = 5;
    mScene->mRootNode->mChildren = new aiNode*[5];
    for (unsigned int i = 0; i< 5;++i ) {
        aiNode* node = mScene->mRootNode->mChildren[i] = new aiNode();
        node->mNumMeshes = 2;
        node->mMeshes = new unsigned int[2];
        node->mMeshes[0] = (i<<1u);
        node->mMeshes[1] = (i<<1u)+1;
    }
}